

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * google::protobuf::io::anon_unknown_1::CopyCordToArray(Cord *cord,uint8_t *target)

{
  byte bVar1;
  Nonnull<cord_internal::CordRep_*> tree;
  size_t sVar2;
  ulong uVar3;
  ulong __n;
  string_view sVar4;
  ChunkIterator __begin3;
  ChunkIterator local_c8;
  
  local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
  local_c8.bytes_remaining_ = 0;
  local_c8.current_chunk_ = (string_view)ZEXT816(0);
  local_c8.btree_reader_.remaining_ = 0;
  local_c8.btree_reader_.navigator_.height_ = -1;
  bVar1 = (cord->contents_).data_.rep_.field_0.data[0];
  tree = (cord->contents_).data_.rep_.field_0.as_tree.rep;
  if (tree == (Nonnull<cord_internal::CordRep_*>)0x0 || ((long)(char)bVar1 & 1U) == 0) {
    if ((bVar1 & 1) != 0) {
      _GLOBAL__N_1::CopyCordToArray();
LAB_0016608c:
      __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                    ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
    }
    local_c8.bytes_remaining_ = (ulong)(long)(char)bVar1 >> 1;
    local_c8.current_chunk_._M_str = (char *)((long)&(cord->contents_).data_.rep_.field_0 + 1);
    local_c8.current_chunk_._M_len = local_c8.bytes_remaining_;
  }
  else {
    local_c8.bytes_remaining_ = tree->length;
    if (local_c8.bytes_remaining_ == 0) {
      return target;
    }
    absl::lts_20240722::Cord::ChunkIterator::InitTree(&local_c8,tree);
  }
  if (local_c8.bytes_remaining_ != 0) {
    sVar4 = local_c8.current_chunk_;
    do {
      sVar2 = local_c8.bytes_remaining_;
      __n = sVar4._M_len;
      memcpy(target,sVar4._M_str,__n);
      target = target + __n;
      uVar3 = sVar2 - __n;
      if (sVar2 < __n) goto LAB_0016608c;
      local_c8.bytes_remaining_ = uVar3;
      if (uVar3 != 0) {
        if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
           (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_] ==
            (CordRepBtree *)0x0)) {
          if (__n == 0) {
            __assert_fail("!current_chunk_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/strings/cord.h"
                          ,0x621,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
          }
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          sVar4 = (string_view)ZEXT816(0);
        }
        else {
          sVar4 = absl::lts_20240722::cord_internal::CordRepBtreeReader::Next
                            (&local_c8.btree_reader_);
          local_c8.current_chunk_ = sVar4;
        }
      }
    } while (local_c8.bytes_remaining_ != 0);
  }
  return target;
}

Assistant:

inline uint8_t* CopyCordToArray(const absl::Cord& cord, uint8_t* target) {
  for (absl::string_view sv : cord.Chunks()) {
    memcpy(target, sv.data(), sv.size());
    target += sv.size();
  }
  return target;
}